

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O1

_Bool COSE_Sign_AddSigner(HCOSE_SIGN hSign,HCOSE_SIGNER hSigner,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback in_RAX;
  cn_cbor *cb_value;
  cn_cbor_errback cbor_error;
  cn_cbor_errback local_28;
  
  if (((hSign == (HCOSE_SIGN)0x0) ||
      (local_28 = in_RAX, _Var1 = _COSE_IsInList(SignRoot,(COSE *)hSign), !_Var1)) ||
     (_Var1 = IsValidSignerHandle(hSigner), !_Var1)) {
    cVar2 = COSE_ERR_INVALID_HANDLE;
    if (perr == (cose_errback *)0x0) goto LAB_0020642f;
  }
  else {
    *(undefined8 *)(hSigner + 0x60) = *(undefined8 *)(hSign + 0x58);
    *(HCOSE_SIGNER *)(hSign + 0x58) = hSigner;
    cb_value = _COSE_arrayget_int((COSE *)hSign,3);
    if (cb_value == (cn_cbor *)0x0) {
      cb_value = cn_cbor_array_create(&local_28);
      if (cb_value != (cn_cbor *)0x0) {
        _Var1 = _COSE_array_replace((COSE *)hSign,cb_value,3,&local_28);
        if (!_Var1) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR(local_28);
            perr->err = cVar2;
          }
          return false;
        }
        goto LAB_00206408;
      }
    }
    else {
LAB_00206408:
      _Var1 = cn_cbor_array_append(cb_value,*(cn_cbor **)(hSigner + 0x18),&local_28);
      if (_Var1) {
        *(int *)(hSigner + 0x10) = *(int *)(hSigner + 0x10) + 1;
        return true;
      }
    }
    if (perr == (cose_errback *)0x0) goto LAB_0020642f;
    cVar2 = _MapFromCBOR(local_28);
  }
  perr->err = cVar2;
LAB_0020642f:
  cn_cbor_free((cn_cbor *)0x0);
  return false;
}

Assistant:

bool COSE_Sign_AddSigner(HCOSE_SIGN hSign, HCOSE_SIGNER hSigner, cose_errback * perr)
{
	COSE_SignerInfo * pSigner;
	COSE_SignMessage * pSign;
	cn_cbor * pSigners = NULL;
	cn_cbor * pSignersT = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidSignHandle(hSign), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(IsValidSignerHandle(hSigner), COSE_ERR_INVALID_HANDLE);

	pSign = (COSE_SignMessage *)hSign;
	pSigner = (COSE_SignerInfo *)hSigner;

	pSigner->m_signerNext = pSign->m_signerFirst;
	pSign->m_signerFirst = pSigner;

#ifdef USE_CBOR_CONTEXT
	context = &pSign->m_message.m_allocContext;
#endif // USE_CBOR_CONTEXT

	pSigners = _COSE_arrayget_int(&pSign->m_message, INDEX_SIGNERS);
	if (pSigners == NULL) {
		pSignersT = cn_cbor_array_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(pSignersT != NULL, cbor_error);

		CHECK_CONDITION_CBOR(_COSE_array_replace(&pSign->m_message, pSignersT, INDEX_SIGNERS, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
		pSigners = pSignersT;
		pSignersT = NULL;
	}

	CHECK_CONDITION_CBOR(cn_cbor_array_append(pSigners, pSigner->m_message.m_cbor, &cbor_error), cbor_error);
	pSigner->m_message.m_refCount++;

	return true;

errorReturn:
	if (pSignersT == NULL) CN_CBOR_FREE(pSignersT, context);
	return false;
}